

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

bool __thiscall libcellml::Model::doAddComponent(Model *this,ComponentPtr *component)

{
  bool bVar1;
  ComponentImpl *this_00;
  shared_ptr<libcellml::Model> thisModel;
  EntityPtr local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ParentedEntity local_40;
  ParentedEntity local_30;
  
  std::__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  bVar1 = ParentedEntity::hasParent
                    ((ParentedEntity *)
                     (component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (bVar1) {
    ParentedEntity::parent(&local_30);
    bVar1 = local_50 != (element_type *)local_30.super_Entity._vptr_Entity;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30.super_Entity.mPimpl);
    }
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
    ParentedEntity::parent(&local_40);
    local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_40.super_Entity._vptr_Entity;
    local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_Entity.mPimpl;
    local_40.super_Entity._vptr_Entity = (_func_int **)0x0;
    local_40.super_Entity.mPimpl = (EntityImpl *)0x0;
    removeComponentFromEntity(&local_60,component);
    if (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40.super_Entity.mPimpl);
    }
  }
  this_00 = Component::pFunc((component->
                             super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
  local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
  local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  ParentedEntity::ParentedEntityImpl::setParent
            ((ParentedEntityImpl *)this_00,(ParentedEntityPtr *)&local_60);
  if (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  bVar1 = ComponentEntity::doAddComponent(&this->super_ComponentEntity,component);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return bVar1;
}

Assistant:

bool Model::doAddComponent(const ComponentPtr &component)
{
    auto thisModel = shared_from_this();
    if (component->hasParent() && (thisModel != component->parent())) {
        removeComponentFromEntity(component->parent(), component);
    }
    component->pFunc()->setParent(thisModel);

    return ComponentEntity::doAddComponent(component);
}